

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

int __thiscall NDeviceChannel::copy(NDeviceChannel *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  NDeviceChannel *this_00;
  NDeviceChannel *newObj;
  string *in_stack_ffffffffffffffc8;
  NDeviceChannel *in_stack_ffffffffffffffe0;
  
  this_00 = (NDeviceChannel *)operator_new(0x40);
  NDeviceChannel(in_stack_ffffffffffffffe0);
  setId(this,in_stack_ffffffffffffffc8);
  setStartByte(this_00,this->startByte);
  setStartBit(this_00,this->startBit);
  setType(this_00,this->type);
  setInterleavedDataBit(this_00,this->interleavedDataBit);
  setInterleavedDataByte(this_00,this->interleavedDataByte);
  return (int)this_00;
}

Assistant:

NDeviceChannel* NDeviceChannel::copy() {
    NDeviceChannel *newObj = new NDeviceChannel();
    newObj->setId(id);
    newObj->setStartByte(startByte);
    newObj->setStartBit(startBit);
    newObj->setType(type);
    newObj->setInterleavedDataBit(interleavedDataBit);
    newObj->setInterleavedDataByte(interleavedDataByte);
    return(newObj);
}